

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O1

void XPMPRegisterPlaneNotifierFunc(XPMPPlaneNotifier_f inFunc,void *inRefcon)

{
  undefined8 *puVar1;
  _List_node_base *p_Var2;
  
  puVar1 = DAT_002ef4b0;
  if ((undefined8 **)DAT_002ef4b0 != &DAT_002ef4b0) {
    do {
      if (((XPMPPlaneNotifier_f)puVar1[2] == inFunc) && ((void *)puVar1[3] == inRefcon)) break;
      puVar1 = (undefined8 *)*puVar1;
    } while ((undefined8 **)puVar1 != &DAT_002ef4b0);
    if ((undefined8 **)puVar1 != &DAT_002ef4b0) {
      return;
    }
  }
  p_Var2 = (_List_node_base *)operator_new(0x20);
  p_Var2[1]._M_next = (_List_node_base *)inFunc;
  p_Var2[1]._M_prev = (_List_node_base *)inRefcon;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  DAT_002ef4c0 = DAT_002ef4c0 + 1;
  if (0 < XPMP2::glob) {
    return;
  }
  XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
                ,0x223,"XPMPRegisterPlaneNotifierFunc",logDEBUG,"%lu observers registered");
  return;
}

Assistant:

void            XPMPRegisterPlaneNotifierFunc(XPMPPlaneNotifier_f       inFunc,
                                              void *                    inRefcon)
{
    // Avoid duplicate entries
    XPMPPlaneNotifierTy observer (inFunc, inRefcon);
    if (std::find(glob.listObservers.begin(),
                  glob.listObservers.end(),
                  observer) == glob.listObservers.end()) {
        glob.listObservers.emplace_back(std::move(observer));
        LOG_MSG(logDEBUG, "%lu observers registered",
                (unsigned long)glob.listObservers.size());
    }
}